

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

list * list_create(void)

{
  list *plVar1;
  
  plVar1 = (list *)calloc(1,0x18);
  return plVar1;
}

Assistant:

struct list *list_create(void)
{
        struct list *list = malloc(sizeof(struct list));

        if (list == NULL) {
                return NULL;
        }

        list->head = NULL;
        list->tail = NULL;
        list->size = 0;

        return list;
}